

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O2

bool cycle_get(stagewise_poly *poly,uint64_t wid)

{
  uint8_t *puVar1;
  uint64_t uVar2;
  
  puVar1 = poly->depthsbits;
  uVar2 = wid_mask_un_shifted(poly,wid);
  return (bool)((puVar1[uVar2 * 2 + 1] & 2) >> 1);
}

Assistant:

inline bool cycle_get(const stagewise_poly &poly, uint64_t wid)
{
  // note: intentionally leaving out ft_offset.
  assert(wid % stride_shift(poly, 1) == 0);
  if ((poly.depthsbits[wid_mask_un_shifted(poly, wid) * 2 + 1] & cycle_bit) > 0)
    return true;
  else
    return false;
}